

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsgpp_unittest.cc
# Opt level: O3

void __thiscall
StunMsgCxx_RFC5769SampleRequestLongTerm_Test::TestBody
          (StunMsgCxx_RFC5769SampleRequestLongTerm_Test *this)

{
  anon_unknown_dwarf_24028 aVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  long *plVar4;
  pointer msg_hdr;
  bool bVar5;
  uint16_t uVar6;
  int iVar7;
  size_t sVar8;
  _stun_attr_varsize *p_Var9;
  stun_attr_msgint *msgint;
  stun_attr_hdr *psVar10;
  pointer pcVar11;
  char *expected_predicate_value;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  message message;
  char realm [12];
  char nonce [29];
  char username [19];
  uint8_t key [16];
  char password [10];
  uint8_t tsx_id [12];
  undefined1 local_130 [32];
  varsize<char> local_110;
  varsize<char> local_f0;
  msgint local_d0;
  base_message<std::allocator<unsigned_char>_> local_c0;
  undefined8 local_a8;
  char local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  uint8_t local_58 [16];
  undefined8 local_48;
  undefined2 local_40;
  uint8_t local_38 [16];
  
  local_78._M_dataplus._M_p = (pointer)0x83e38883e39e83e3;
  local_78._M_string_length._0_7_ = 0xaf82e38383e3aa;
  local_78._15_4_ = 0xb982e3;
  local_48 = 0x497274614d656854;
  local_40 = 0x58;
  local_98.field_2._M_allocated_capacity._0_5_ = 0x5346394c6f;
  local_98.field_2._M_local_buf[5] = 'T';
  local_98.field_2._M_local_buf[6] = 'v';
  local_98.field_2._M_local_buf[7] = 'y';
  local_98.field_2._M_local_buf[8] = '6';
  local_98.field_2._M_local_buf[9] = '4';
  local_98.field_2._M_local_buf[10] = 's';
  local_98.field_2._M_local_buf[0xb] = 'A';
  local_98.field_2._M_local_buf[0xc] = '\0';
  local_98._M_dataplus._M_p = (pointer)0x396b3939342f2f66;
  local_98._M_string_length._0_5_ = 0x4f36643435;
  local_98._M_string_length._5_3_ = 0x34334c;
  local_a8._0_1_ = 'e';
  local_a8._1_1_ = 'x';
  local_a8._2_1_ = 'a';
  local_a8._3_1_ = 'm';
  local_a8._4_1_ = 'p';
  local_a8._5_1_ = 'l';
  local_a8._6_1_ = 'e';
  local_a8._7_1_ = '.';
  builtin_strncpy(local_a0,"org",4);
  local_38[0] = 'x';
  local_38[1] = 0xad;
  local_38[2] = '4';
  local_38[3] = '3';
  local_38[4] = 0xc6;
  local_38[5] = 0xad;
  local_38[6] = 'r';
  local_38[7] = 0xc0;
  local_38[8] = ')';
  local_38[9] = 0xda;
  local_38[10] = 'A';
  local_38[0xb] = '.';
  expected_predicate_value = &DAT_00000009;
  stun_genkey(&local_78,0x12,(_stun_attr_varsize *)&local_a8,0xb,&local_48,9,local_58);
  stun::base_message<std::allocator<unsigned_char>_>::base_message(&local_c0,1,local_38);
  sVar8 = strlen((char *)&local_78);
  local_130._16_8_ = (long)&local_78._M_dataplus._M_p + sVar8;
  local_130[0] = (internal)0x6;
  local_130[1] = 0;
  local_130[0x18] = '\0';
  local_130._8_8_ = &local_78;
  stun::base_message<std::allocator<unsigned_char>>::push_back<stun::attribute::bits::varsize<char>>
            ((base_message<std::allocator<unsigned_char>> *)&local_c0,(varsize<char> *)local_130);
  sVar8 = strlen((char *)&local_98);
  local_110.end_ = (char *)((long)&local_98._M_dataplus._M_p + sVar8);
  local_110.type_ = 0x15;
  local_110.pad_ = '\0';
  local_110.begin_ = (char *)&local_98;
  stun::base_message<std::allocator<unsigned_char>>::push_back<stun::attribute::bits::varsize<char>>
            ((base_message<std::allocator<unsigned_char>> *)&local_c0,&local_110);
  sVar8 = strlen((char *)&local_a8);
  local_f0.end_ = (char *)((long)&local_a8 + sVar8);
  local_f0.type_ = 0x14;
  local_f0.pad_ = '\0';
  local_f0.begin_ = (char *)&local_a8;
  stun::base_message<std::allocator<unsigned_char>>::push_back<stun::attribute::bits::varsize<char>>
            ((base_message<std::allocator<unsigned_char>> *)&local_c0,&local_f0);
  local_d0.key_len_ = 0x10;
  local_d0.key_ = local_58;
  stun::base_message<std::allocator<unsigned_char>_>::push_back<stun::attribute::bits::msgint>
            (&local_c0,&local_d0);
  local_110._0_8_ = &DAT_00000074;
  local_f0._0_8_ =
       stun_msg_len((stun_msg_hdr *)
                    local_c0.buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_130,"sizeof(expected_result)","message.size()",
             (unsigned_long *)&local_110,(unsigned_long *)&local_f0);
  if (local_130[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = ((_Alloc_hider *)local_130._8_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x19f,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_110._0_8_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_130 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_130 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    anon_unknown.dwarf_24028::IsEqual
              ((anon_unknown_dwarf_24028 *)&local_110,&DAT_0014a460,
               local_c0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,0x74);
    if (local_110.type_._0_1_ == (anon_unknown_dwarf_24028)0x0) {
      testing::Message::Message((Message *)&local_f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_130,(internal *)&local_110,
                 (AssertionResult *)
                 "IsEqual(expected_result, message.data(), sizeof(expected_result))","false","true",
                 expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x1a1,(char *)CONCAT62(local_130._2_6_,CONCAT11(local_130[1],local_130[0])));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
      puVar2 = (undefined1 *)CONCAT62(local_130._2_6_,CONCAT11(local_130[1],local_130[0]));
      if (puVar2 != local_130 + 0x10) {
        operator_delete(puVar2,(ulong)(local_130._16_8_ + 1));
      }
      if ((AssertHelperData *)local_f0._0_8_ != (AssertHelperData *)0x0) {
        bVar5 = testing::internal::IsTrue(true);
        if ((bVar5) &&
           ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_f0._0_8_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_f0._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_110.begin_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_110._0_4_ = 1;
    uVar6 = stun_msg_type((stun_msg_hdr *)
                          local_c0.buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    local_f0.type_ = uVar6;
    testing::internal::
    CmpHelperEQ<stun::base_message<std::allocator<unsigned_char>>::type,unsigned_short>
              ((internal *)local_130,"stun::message::binding_request","message.type()",
               (type *)&local_110,&local_f0.type_);
    if (local_130[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_110);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar11 = "";
      }
      else {
        pcVar11 = ((_Alloc_hider *)local_130._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x1a5,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar5 = testing::internal::IsTrue(true);
        if ((bVar5) &&
           ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_110._0_8_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_110._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_130 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    msg_hdr = local_c0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start;
    p_Var9 = (_stun_attr_varsize *)
             stun_msg_next_attr((stun_msg_hdr *)
                                local_c0.buffer_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,(stun_attr_hdr *)0x0);
    local_110.type_._0_1_ = (anon_unknown_dwarf_24028)(p_Var9 != (_stun_attr_varsize *)0x0);
    local_110.begin_ = (char *)0x0;
    if (p_Var9 == (_stun_attr_varsize *)0x0) {
      testing::Message::Message((Message *)&local_f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_130,(internal *)&local_110,(AssertionResult *)"message.end() != i",
                 "false","true",expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x1a8,(char *)CONCAT62(local_130._2_6_,CONCAT11(local_130[1],local_130[0])));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
      puVar2 = (undefined1 *)CONCAT62(local_130._2_6_,CONCAT11(local_130[1],local_130[0]));
      if (puVar2 != local_130 + 0x10) {
        operator_delete(puVar2,(ulong)(local_130._16_8_ + 1));
      }
      if ((AssertHelperData *)local_f0._0_8_ != (AssertHelperData *)0x0) {
        bVar5 = testing::internal::IsTrue(true);
        if ((bVar5) &&
           ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_f0._0_8_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_f0._0_8_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_110.begin_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_110.begin_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_110._0_4_ = 6;
      uVar6 = stun_attr_type((stun_attr_hdr *)p_Var9);
      local_f0.type_ = uVar6;
      testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
                ((internal *)local_130,"type::username","i->type()",(attribute_type *)&local_110,
                 &local_f0.type_);
      if (local_130[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_110);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130._8_8_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar11 = "";
        }
        else {
          pcVar11 = ((_Alloc_hider *)local_130._8_8_)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0x1a9,pcVar11);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&local_110);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_110._0_8_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar5 = testing::internal::IsTrue(true);
          if ((bVar5) &&
             ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_110._0_8_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_110._0_8_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_130 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_f0._0_8_ = msg_hdr;
      local_f0.begin_ = (char *)p_Var9;
      stun::attribute::decoding_bits::string::to_string_abi_cxx11_
                ((string *)local_130,(string *)&local_f0);
      testing::internal::CmpHelperEQ<char[19],std::__cxx11::string>
                ((internal *)&local_110,"username","i->to<type::username>().to_string()",
                 (char (*) [19])&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130);
      puVar2 = local_130 + 0x10;
      puVar3 = (undefined1 *)CONCAT62(local_130._2_6_,CONCAT11(local_130[1],local_130[0]));
      if (puVar3 != puVar2) {
        operator_delete(puVar3,(ulong)(local_130._16_8_ + 1));
      }
      if (local_110.type_._0_1_ == (anon_unknown_dwarf_24028)0x0) {
        testing::Message::Message((Message *)local_130);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110.begin_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar11 = "";
        }
        else {
          pcVar11 = ((_Alloc_hider *)local_110.begin_)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_f0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0x1ab,pcVar11);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)local_130);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
        if (CONCAT62(local_130._2_6_,CONCAT11(local_130[1],local_130[0])) != 0) {
          bVar5 = testing::internal::IsTrue(true);
          if ((bVar5) &&
             (plVar4 = (long *)CONCAT62(local_130._2_6_,CONCAT11(local_130[1],local_130[0])),
             plVar4 != (long *)0x0)) {
            (**(code **)(*plVar4 + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_110.begin_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_110.begin_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        p_Var9 = (_stun_attr_varsize *)
                 stun_msg_next_attr((stun_msg_hdr *)msg_hdr,(stun_attr_hdr *)p_Var9);
        local_110.type_._0_1_ = (anon_unknown_dwarf_24028)(p_Var9 != (_stun_attr_varsize *)0x0);
        local_110.begin_ = (char *)0x0;
        if (p_Var9 == (_stun_attr_varsize *)0x0) {
          testing::Message::Message((Message *)&local_f0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_130,(internal *)&local_110,
                     (AssertionResult *)"message.end() != ++i","false","true",
                     expected_predicate_value);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_d0,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                     ,0x1ad,(char *)CONCAT62(local_130._2_6_,CONCAT11(local_130[1],local_130[0])));
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_f0)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
          puVar3 = (undefined1 *)CONCAT62(local_130._2_6_,CONCAT11(local_130[1],local_130[0]));
          if (puVar3 != puVar2) {
            operator_delete(puVar3,(ulong)(local_130._16_8_ + 1));
          }
          if ((AssertHelperData *)local_f0._0_8_ != (AssertHelperData *)0x0) {
            bVar5 = testing::internal::IsTrue(true);
            if ((bVar5) &&
               ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_f0._0_8_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_f0._0_8_ + 8))();
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_110.begin_,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_110.begin_,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          local_110._0_4_ = 0x15;
          uVar6 = stun_attr_type((stun_attr_hdr *)p_Var9);
          local_f0.type_ = uVar6;
          testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
                    ((internal *)local_130,"type::nonce","i->type()",(attribute_type *)&local_110,
                     &local_f0.type_);
          if (local_130[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_110);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130._8_8_
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar11 = "";
            }
            else {
              pcVar11 = ((_Alloc_hider *)local_130._8_8_)->_M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_f0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                       ,0x1ae,pcVar11);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_f0,(Message *)&local_110);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
            if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_110._0_8_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar5 = testing::internal::IsTrue(true);
              if ((bVar5) &&
                 ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_110._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_110._0_8_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(local_130 + 8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          local_f0._0_8_ = msg_hdr;
          local_f0.begin_ = (char *)p_Var9;
          stun::attribute::decoding_bits::string::to_string_abi_cxx11_
                    ((string *)local_130,(string *)&local_f0);
          testing::internal::CmpHelperEQ<char[29],std::__cxx11::string>
                    ((internal *)&local_110,"nonce","i->to<type::nonce>().to_string()",
                     (char (*) [29])&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130)
          ;
          puVar3 = (undefined1 *)CONCAT62(local_130._2_6_,CONCAT11(local_130[1],local_130[0]));
          if (puVar3 != puVar2) {
            operator_delete(puVar3,(ulong)(local_130._16_8_ + 1));
          }
          if (local_110.type_._0_1_ == (anon_unknown_dwarf_24028)0x0) {
            testing::Message::Message((Message *)local_130);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_110.begin_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar11 = "";
            }
            else {
              pcVar11 = ((_Alloc_hider *)local_110.begin_)->_M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_f0,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                       ,0x1b0,pcVar11);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_f0,(Message *)local_130);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
            if (CONCAT62(local_130._2_6_,CONCAT11(local_130[1],local_130[0])) != 0) {
              bVar5 = testing::internal::IsTrue(true);
              if ((bVar5) &&
                 (plVar4 = (long *)CONCAT62(local_130._2_6_,CONCAT11(local_130[1],local_130[0])),
                 plVar4 != (long *)0x0)) {
                (**(code **)(*plVar4 + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_110.begin_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_110.begin_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            p_Var9 = (_stun_attr_varsize *)
                     stun_msg_next_attr((stun_msg_hdr *)msg_hdr,(stun_attr_hdr *)p_Var9);
            local_110.type_._0_1_ = (anon_unknown_dwarf_24028)(p_Var9 != (_stun_attr_varsize *)0x0);
            local_110.begin_ = (char *)0x0;
            if (p_Var9 == (_stun_attr_varsize *)0x0) {
              testing::Message::Message((Message *)&local_f0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_130,(internal *)&local_110,
                         (AssertionResult *)"message.end() != ++i","false","true",
                         expected_predicate_value);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_d0,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                         ,0x1b2,(char *)CONCAT62(local_130._2_6_,CONCAT11(local_130[1],local_130[0])
                                                ));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_d0,(Message *)&local_f0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
              puVar3 = (undefined1 *)CONCAT62(local_130._2_6_,CONCAT11(local_130[1],local_130[0]));
              if (puVar3 != puVar2) {
                operator_delete(puVar3,(ulong)(local_130._16_8_ + 1));
              }
              if ((AssertHelperData *)local_f0._0_8_ != (AssertHelperData *)0x0) {
                bVar5 = testing::internal::IsTrue(true);
                if ((bVar5) &&
                   ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_f0._0_8_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
                {
                  (**(code **)(*(long *)local_f0._0_8_ + 8))();
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_110.begin_,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_110.begin_,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              local_110._0_4_ = 0x14;
              uVar6 = stun_attr_type((stun_attr_hdr *)p_Var9);
              local_f0.type_ = uVar6;
              testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
                        ((internal *)local_130,"type::realm","i->type()",
                         (attribute_type *)&local_110,&local_f0.type_);
              if (local_130[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_110);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_130._8_8_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar11 = "";
                }
                else {
                  pcVar11 = ((_Alloc_hider *)local_130._8_8_)->_M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_f0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                           ,0x1b3,pcVar11);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_f0,(Message *)&local_110);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
                if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_110._0_8_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  bVar5 = testing::internal::IsTrue(true);
                  if ((bVar5) &&
                     ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_110._0_8_ !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     )) {
                    (**(code **)(*(long *)local_110._0_8_ + 8))();
                  }
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(local_130 + 8),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              local_f0._0_8_ = msg_hdr;
              local_f0.begin_ = (char *)p_Var9;
              stun::attribute::decoding_bits::string::to_string_abi_cxx11_
                        ((string *)local_130,(string *)&local_f0);
              testing::internal::CmpHelperEQ<char[12],std::__cxx11::string>
                        ((internal *)&local_110,"realm","i->to<type::realm>().to_string()",
                         (char (*) [12])&local_a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_130);
              puVar3 = (undefined1 *)CONCAT62(local_130._2_6_,CONCAT11(local_130[1],local_130[0]));
              if (puVar3 != puVar2) {
                operator_delete(puVar3,(ulong)(local_130._16_8_ + 1));
              }
              if (local_110.type_._0_1_ == (anon_unknown_dwarf_24028)0x0) {
                testing::Message::Message((Message *)local_130);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_110.begin_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar11 = "";
                }
                else {
                  pcVar11 = ((_Alloc_hider *)local_110.begin_)->_M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_f0,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                           ,0x1b5,pcVar11);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_f0,(Message *)local_130);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
                if (CONCAT62(local_130._2_6_,CONCAT11(local_130[1],local_130[0])) != 0) {
                  bVar5 = testing::internal::IsTrue(true);
                  if ((bVar5) &&
                     (plVar4 = (long *)CONCAT62(local_130._2_6_,CONCAT11(local_130[1],local_130[0]))
                     , plVar4 != (long *)0x0)) {
                    (**(code **)(*plVar4 + 8))();
                  }
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_110.begin_,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_110.begin_,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                msgint = (stun_attr_msgint *)
                         stun_msg_next_attr((stun_msg_hdr *)msg_hdr,(stun_attr_hdr *)p_Var9);
                local_110.type_._0_1_ =
                     (anon_unknown_dwarf_24028)(msgint != (stun_attr_msgint *)0x0);
                local_110.begin_ = (char *)0x0;
                if (msgint == (stun_attr_msgint *)0x0) {
                  testing::Message::Message((Message *)&local_f0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_130,(internal *)&local_110,
                             (AssertionResult *)"message.end() != ++i","false","true",
                             expected_predicate_value);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_d0,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                             ,0x1b7,(char *)CONCAT62(local_130._2_6_,
                                                     CONCAT11(local_130[1],local_130[0])));
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_d0,(Message *)&local_f0);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
                  puVar3 = (undefined1 *)
                           CONCAT62(local_130._2_6_,CONCAT11(local_130[1],local_130[0]));
                  if (puVar3 != puVar2) {
                    operator_delete(puVar3,(ulong)(local_130._16_8_ + 1));
                  }
                  if ((AssertHelperData *)local_f0._0_8_ != (AssertHelperData *)0x0) {
                    bVar5 = testing::internal::IsTrue(true);
                    if ((bVar5) &&
                       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_f0._0_8_ !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0)) {
                      (**(code **)(*(long *)local_f0._0_8_ + 8))();
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_110.begin_,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                }
                else {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_110.begin_,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  local_110._0_4_ = 8;
                  uVar6 = stun_attr_type((stun_attr_hdr *)msgint);
                  local_f0.type_ = uVar6;
                  testing::internal::
                  CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
                            ((internal *)local_130,"type::message_integrity","i->type()",
                             (attribute_type *)&local_110,&local_f0.type_);
                  if (local_130[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_110);
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_130._8_8_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar11 = "";
                    }
                    else {
                      pcVar11 = ((_Alloc_hider *)local_130._8_8_)->_M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_f0,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                               ,0x1b8,pcVar11);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_f0,(Message *)&local_110);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
                    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_110._0_8_ !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      bVar5 = testing::internal::IsTrue(true);
                      if ((bVar5) &&
                         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )local_110._0_8_ !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0)) {
                        (**(code **)(*(long *)local_110._0_8_ + 8))();
                      }
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)(local_130 + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  iVar7 = stun_attr_msgint_check(msgint,(stun_msg_hdr *)msg_hdr,local_58,0x10);
                  aVar1 = (anon_unknown_dwarf_24028)(iVar7 != 0);
                  local_110.begin_ = (char *)0x0;
                  local_110.type_._0_1_ = aVar1;
                  if (iVar7 == 0) {
                    testing::Message::Message((Message *)&local_f0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_130,(internal *)&local_110,
                               (AssertionResult *)
                               "i->to<type::message_integrity>().check_integrity(key, key + sizeof(key))"
                               ,"false","true",expected_predicate_value);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_d0,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                               ,0x1ba,(char *)CONCAT62(local_130._2_6_,
                                                       CONCAT11(local_130[1],local_130[0])));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_d0,(Message *)&local_f0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
                    puVar3 = (undefined1 *)
                             CONCAT62(local_130._2_6_,CONCAT11(local_130[1],local_130[0]));
                    if (puVar3 != puVar2) {
                      operator_delete(puVar3,(ulong)(local_130._16_8_ + 1));
                    }
                    if ((AssertHelperData *)local_f0._0_8_ != (AssertHelperData *)0x0) {
                      bVar5 = testing::internal::IsTrue(true);
                      if ((bVar5) && ((AssertHelperData *)local_f0._0_8_ != (AssertHelperData *)0x0)
                         ) {
                        (**(code **)(*(long *)local_f0._0_8_ + 8))();
                      }
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_110.begin_,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  psVar10 = stun_msg_next_attr((stun_msg_hdr *)msg_hdr,(stun_attr_hdr *)msgint);
                  local_110.type_._0_1_ =
                       (anon_unknown_dwarf_24028)(psVar10 == (stun_attr_hdr *)0x0);
                  local_110.begin_ = (char *)0x0;
                  if (psVar10 != (stun_attr_hdr *)0x0) {
                    testing::Message::Message((Message *)&local_f0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_130,(internal *)&local_110,
                               (AssertionResult *)"message.end() == ++i","false","true",
                               expected_predicate_value);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_d0,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                               ,0x1bc,(char *)CONCAT62(local_130._2_6_,
                                                       CONCAT11(local_130[1],local_130[0])));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_d0,(Message *)&local_f0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
                    puVar3 = (undefined1 *)
                             CONCAT62(local_130._2_6_,CONCAT11(local_130[1],local_130[0]));
                    if (puVar3 != puVar2) {
                      operator_delete(puVar3,(ulong)(local_130._16_8_ + 1));
                    }
                    if ((AssertHelperData *)local_f0._0_8_ != (AssertHelperData *)0x0) {
                      bVar5 = testing::internal::IsTrue(true);
                      if ((bVar5) &&
                         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )local_f0._0_8_ !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0)) {
                        (**(code **)(*(long *)local_f0._0_8_ + 8))();
                      }
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_110.begin_,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                }
              }
            }
          }
        }
      }
    }
  }
  if ((stun_msg_hdr *)
      local_c0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (stun_msg_hdr *)0x0) {
    operator_delete(local_c0.buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(StunMsgCxx, RFC5769SampleRequestLongTerm) {
  const char username[] =
    "\xE3\x83\x9E\xE3"
    "\x83\x88\xE3\x83"
    "\xAA\xE3\x83\x83"
    "\xE3\x82\xAF\xE3"
    "\x82\xB9";
  const char password[] = "TheMatrIX";
  const char nonce[] = "f//499k954d6OL34oL9FSTvy64sA";
  const char realm[] = "example.org";

  const uint8_t expected_result[] = {
    0x00,0x01,0x00,0x60, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0x78,0xad,0x34,0x33, // }
    0xc6,0xad,0x72,0xc0, // }  Transaction ID
    0x29,0xda,0x41,0x2e, // }
    0x00,0x06,0x00,0x12, //    USERNAME attribute header
    0xe3,0x83,0x9e,0xe3, // }
    0x83,0x88,0xe3,0x83, // }
    0xaa,0xe3,0x83,0x83, // }  Username value (0x18,bytes) and padding (2 bytes)
    0xe3,0x82,0xaf,0xe3, // }
    0x82,0xb9,0x00,0x00, // }
    0x00,0x15,0x00,0x1c, //    NONCE attribute header
    0x66,0x2f,0x2f,0x34, // }
    0x39,0x39,0x6b,0x39, // }
    0x35,0x34,0x64,0x36, // }
    0x4f,0x4c,0x33,0x34, // }  Nonce value
    0x6f,0x4c,0x39,0x46, // }
    0x53,0x54,0x76,0x79, // }
    0x36,0x34,0x73,0x41, // }
    0x00,0x14,0x00,0x0b, //    REALM attribute header
    0x65,0x78,0x61,0x6d, // }
    0x70,0x6c,0x65,0x2e, // }  Realm value (0x11,bytes) and padding (1 byte)
    0x6f,0x72,0x67,0x00, // }
    0x00,0x08,0x00,0x14, //    MESSAGE-INTEGRITY attribute header
    0xf6,0x70,0x24,0x65, // }
    0x6d,0xd6,0x4a,0x3e, // }
    0x02,0xb8,0xe0,0x71, // }  HMAC-SHA1 fingerprint
    0x2e,0x85,0xc9,0xa2, // }
    0x8c,0xa8,0x96,0x66, // }
  };

  uint8_t tsx_id[12] = {
    0x78,0xad,0x34,0x33,
    0xc6,0xad,0x72,0xc0,
    0x29,0xda,0x41,0x2e,
  };

  uint8_t key[16];
  stun_genkey(username, sizeof(username)-1, realm, sizeof(realm)-1,
              password, sizeof(password)-1, key);

  stun::message message(stun::message::binding_request, tsx_id);
  message << stun::attribute::username(username)
          << stun::attribute::nonce(nonce)
          << stun::attribute::realm(realm)
          << stun::attribute::message_integrity(key, sizeof(key));
  ASSERT_EQ(sizeof(expected_result), message.size());
  EXPECT_TRUE(IsEqual(expected_result, message.data(),
      sizeof(expected_result)));

  // Now decoding
  using namespace stun::attribute;
  EXPECT_EQ(stun::message::binding_request, message.type());

  stun::message::iterator i = message.begin();
  ASSERT_TRUE(message.end() != i);
  EXPECT_EQ(type::username, i->type());
  ASSERT_EQ(username,
    i->to<type::username>().to_string());

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::nonce, i->type());
  ASSERT_EQ(nonce,
    i->to<type::nonce>().to_string());

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::realm, i->type());
  ASSERT_EQ(realm,
    i->to<type::realm>().to_string());

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::message_integrity, i->type());
  EXPECT_TRUE(
    i->to<type::message_integrity>().check_integrity(key, key + sizeof(key)));

  ASSERT_TRUE(message.end() == ++i);
}